

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_cpols.cc
# Opt level: O0

int i2r_certpol(X509V3_EXT_METHOD *method,void *ext,BIO *out,int indent)

{
  POLICYINFO *pPVar1;
  POLICYINFO *pinfo;
  size_t i;
  stack_st_POLICYINFO *pol;
  int indent_local;
  BIO *out_local;
  void *ext_local;
  X509V3_EXT_METHOD *method_local;
  
  pinfo = (POLICYINFO *)0x0;
  while( true ) {
    pPVar1 = (POLICYINFO *)sk_POLICYINFO_num((stack_st_POLICYINFO *)ext);
    if (pPVar1 <= pinfo) break;
    pPVar1 = sk_POLICYINFO_value((stack_st_POLICYINFO *)ext,(size_t)pinfo);
    BIO_printf((BIO *)out,"%*sPolicy: ",(ulong)(uint)indent,"");
    i2a_ASN1_OBJECT((BIO *)out,(ASN1_OBJECT *)pPVar1->policyid);
    BIO_puts((BIO *)out,"\n");
    if (pPVar1->qualifiers != (stack_st_POLICYQUALINFO *)0x0) {
      print_qualifiers(out,pPVar1->qualifiers,indent + 2);
    }
    pinfo = (POLICYINFO *)((long)&pinfo->policyid + 1);
  }
  return 1;
}

Assistant:

static int i2r_certpol(const X509V3_EXT_METHOD *method, void *ext, BIO *out,
                       int indent) {
  const STACK_OF(POLICYINFO) *pol =
      reinterpret_cast<const STACK_OF(POLICYINFO) *>(ext);
  // First print out the policy OIDs
  for (size_t i = 0; i < sk_POLICYINFO_num(pol); i++) {
    const POLICYINFO *pinfo = sk_POLICYINFO_value(pol, i);
    BIO_printf(out, "%*sPolicy: ", indent, "");
    i2a_ASN1_OBJECT(out, pinfo->policyid);
    BIO_puts(out, "\n");
    if (pinfo->qualifiers) {
      print_qualifiers(out, pinfo->qualifiers, indent + 2);
    }
  }
  return 1;
}